

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr
          (unique_ptr<Catch::Detail::EnumInfo> *this)

{
  EnumInfo *this_00;
  unique_ptr<Catch::Detail::EnumInfo> *this_local;
  
  this_00 = this->m_ptr;
  if (this_00 != (EnumInfo *)0x0) {
    EnumInfo::~EnumInfo(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }